

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O1

LClosure * luaF_newLclosure(lua_State *L,int nupvals)

{
  LClosure *pLVar1;
  
  pLVar1 = (LClosure *)luaC_newobj(L,6,(long)(nupvals * 8 + 0x20));
  pLVar1->p = (Proto *)0x0;
  pLVar1->nupvalues = (lu_byte)nupvals;
  if (nupvals != 0) {
    memset((void *)((long)pLVar1 + (long)(int)(nupvals - 1U) * 8 + (ulong)(nupvals - 1U) * -8 + 0x20
                   ),0,(ulong)(uint)nupvals << 3);
  }
  return pLVar1;
}

Assistant:

LClosure *luaF_newLclosure (lua_State *L, int nupvals) {
  GCObject *o = luaC_newobj(L, LUA_VLCL, sizeLclosure(nupvals));
  LClosure *c = gco2lcl(o);
  c->p = NULL;
  c->nupvalues = cast_byte(nupvals);
  while (nupvals--) c->upvals[nupvals] = NULL;
  return c;
}